

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseOutgoing.cpp
# Opt level: O1

void __thiscall
tonk::SessionOutgoing::sendQueuedDatagram
          (SessionOutgoing *this,OutgoingQueuedDatagram *datagram,uint sequenceNumberBytes,
          uint sequenceNumber)

{
  uint8_t *data;
  SimpleCipher *this_00;
  bool bVar1;
  undefined4 uVar2;
  ulong uVar3;
  IUDPSender *pIVar4;
  SenderBandwidthControl *pSVar5;
  uint uVar6;
  uint16_t uVar7;
  uint16_t uVar8;
  uint8_t *puVar9;
  uint64_t uVar10;
  byte bVar11;
  uint uVar12;
  uint uVar13;
  int iVar14;
  uint uVar15;
  ulong uVar16;
  
  data = datagram->Data;
  uVar13 = datagram->NextWriteOffset;
  uVar16 = (ulong)uVar13;
  if (((this->Deps).EnablePadding == true) &&
     (uVar15 = (this->super_OutgoingQueueCommon).MaxMessageSectionBytes, uVar13 + 2 <= uVar15)) {
    uVar3 = (this->PaddingPRNG).State;
    (this->PaddingPRNG).State = uVar3 * 0x5851f42d4c957f2d + (this->PaddingPRNG).Inc;
    uVar12 = (uint)(uVar3 >> 0x2d) ^ (uint)(uVar3 >> 0x1b);
    bVar11 = (byte)(uVar3 >> 0x3b);
    uVar6 = uVar15 - uVar13;
    if (uVar13 + (byte)TONK_RAND_PAD_EXP[(uVar12 >> bVar11 | uVar12 << 0x20 - bVar11) & 0xff] <=
        uVar15) {
      uVar6 = (uint)(byte)TONK_RAND_PAD_EXP[(uVar12 >> bVar11 | uVar12 << 0x20 - bVar11) & 0xff];
    }
    if (1 < uVar6) {
      *(ushort *)(datagram->Data + uVar16 + 2 + -2) = (ushort)(uVar6 - 2) | 0x2000;
      memset(datagram->Data + uVar16 + 2,0,(ulong)(uVar6 - 2));
      uVar16 = (ulong)(uVar6 + uVar13);
    }
  }
  puVar9 = data + uVar16;
  bVar1 = this->ShouldCompressSequenceNumbers;
  bVar11 = bVar1 << 5 | 0x80;
  if (sequenceNumberBytes != 0) {
    bVar11 = bVar11 | (byte)sequenceNumberBytes;
    *(uint *)puVar9 = sequenceNumber;
    puVar9 = puVar9 + sequenceNumberBytes;
  }
  uVar10 = this->NextNonce;
  this->NextNonce = uVar10 + 1;
  uVar13 = 3;
  if (bVar1 != false) {
    uVar15 = (uint)uVar10 - (int)(this->LastAck).PeerNextExpectedNonce.Value;
    uVar13 = 0;
    if (uVar15 != 1) {
      uVar6 = -uVar15;
      if (0 < (int)uVar15) {
        uVar6 = uVar15;
      }
      uVar13 = 1;
      if (0x7e < uVar6) {
        uVar13 = 3 - (uVar6 < 0x7fff);
      }
    }
  }
  *(uint *)puVar9 = (uint)uVar10;
  bVar11 = (char)uVar13 * '\x04' | bVar11;
  puVar9 = puVar9 + uVar13;
  if (((this->ShouldAttachHandshake)._M_base._M_i & 1U) != 0) {
    bVar11 = bVar11 | 0x40;
    uVar2 = *(undefined4 *)(this->Handshake + 8);
    *(undefined8 *)puVar9 = *(undefined8 *)this->Handshake;
    *(undefined4 *)(puVar9 + 8) = uVar2;
    puVar9 = puVar9 + 0xc;
  }
  uVar13 = (int)puVar9 - (int)data;
  puVar9[3] = bVar11;
  this_00 = &this->Encryptor;
  security::SimpleCipher::Cipher(this_00,data,(uint)uVar16,uVar10);
  uVar7 = security::SimpleCipher::Tag(this_00,data,uVar13,uVar10);
  iVar14 = uVar13 + 6;
  uVar10 = siamese::GetTimeUsec();
  uVar8 = security::SimpleCipher::TagInt(this_00,(uint)bVar11 | (int)(uVar10 >> 3) << 8);
  puVar9[2] = (char)(uVar10 >> 0x13);
  *(short *)puVar9 = (short)(uVar10 >> 3);
  *(uint16_t *)(puVar9 + 4) = uVar8 ^ uVar7;
  uVar13 = datagram->CompressionSavings;
  pIVar4 = (this->Deps).UDPSender;
  (*pIVar4->_vptr_IUDPSender[2])(pIVar4,&this->PeerUDPAddress,(this->Deps).ConnectionRef);
  pSVar5 = (this->Deps).SenderControl;
  LOCK();
  (pSVar5->AvailableTokens).super___atomic_base<int>._M_i =
       (pSVar5->AvailableTokens).super___atomic_base<int>._M_i - iVar14;
  UNLOCK();
  if (sequenceNumberBytes != 0) {
    pSVar5->RecoverySendTokens = pSVar5->RecoverySendTokens + 0x400;
  }
  pSVar5->ProbeSendTokens = pSVar5->ProbeSendTokens + uVar13 + iVar14;
  return;
}

Assistant:

void SessionOutgoing::sendQueuedDatagram(
    OutgoingQueuedDatagram* datagram,
    unsigned sequenceNumberBytes,
    unsigned sequenceNumber)
{
    // If this function changes, also update PostRecovery() and PostDummyDatagram() to keep it in sync.

    uint8_t* datagramData = datagram->Data;
    unsigned messageBytes = datagram->NextWriteOffset;

    TONK_DEBUG_ASSERT(messageBytes > 0);

#ifdef TONK_ENABLE_RANDOM_PADDING
    unsigned paddingBytes = 0;

    // If there is room for one more message in the datagram:
    if (Deps.EnablePadding &&
        messageBytes + protocol::kMessageFrameBytes <= MaxMessageSectionBytes)
    {
        // Select the number of bytes to pad
        unsigned targetPadBytes = TONK_RAND_PAD_EXP[PaddingPRNG.Next() % 256];

        TONK_DEBUG_ASSERT(targetPadBytes <= protocol::kMaxRandomPaddingBytes);
        if (messageBytes + targetPadBytes > MaxMessageSectionBytes) {
            targetPadBytes = MaxMessageSectionBytes - messageBytes;
        }

        // If there is at least a frame worth of padding:
        if (targetPadBytes >= protocol::kMessageFrameBytes)
        {
            // Write frame header
            protocol::WriteMessageFrameHeader(
                datagramData + messageBytes,
                protocol::MessageType_Padding,
                targetPadBytes - protocol::kMessageFrameBytes);

            // Zero the padding bytes to avoid sending confidential data
            memset(
                datagramData + messageBytes + protocol::kMessageFrameBytes,
                0,
                targetPadBytes - protocol::kMessageFrameBytes);

            paddingBytes += targetPadBytes;
            messageBytes += targetPadBytes;
        }
    }
#endif // TONK_ENABLE_RANDOM_PADDING

    uint8_t* footer = datagramData + messageBytes;
    uint8_t flags = protocol::kConnectionMask;
    if (ShouldCompressSequenceNumbers) {
        flags |= protocol::kSeqCompMask;
    }

    if (sequenceNumberBytes > 0)
    {
        flags |= sequenceNumberBytes;
        protocol::WriteFooterField(footer, sequenceNumber, sequenceNumberBytes);
        footer += sequenceNumberBytes;
    }

    // Write packet nonce to header
    unsigned nonceBytes;
    const NonceT nonce = writeNonce(footer, nonceBytes);
    flags |= nonceBytes << 2;
    footer += nonceBytes;

    if (ShouldAttachHandshake)
    {
        flags |= protocol::kHandshakeMask;
        const uint32_t b = siamese::ReadU32_LE(Handshake + 8);
        const uint64_t a = siamese::ReadU64_LE(Handshake);
        siamese::WriteU64_LE(footer, a);
        siamese::WriteU32_LE(footer + 8, b);
        footer += protocol::kHandshakeBytes;
    }

    // Tag checksum includes all the data before the timestamp
    const unsigned taggedBytes = (unsigned)(footer - datagramData);

    // Skip over the timestamp
    uint8_t* timestampData = footer;
    footer += protocol::kTimestampBytes;

    // Write flags
    footer[0] = flags;
    ++footer;

    // Encrypt message data but not the footer
    Encryptor.Cipher(datagramData, messageBytes, nonce);

    // Generate the main packet data tag
    uint16_t tag = Encryptor.Tag(datagramData, taggedBytes, nonce);
    static_assert(protocol::kEncryptionTagBytes == 2, "Update this if that changes");
    uint8_t* tagData = footer;

    const unsigned sendBytes = taggedBytes + protocol::kUntaggedDatagramBytes;

    DatagramBuffer datagramBuffer;
    datagramBuffer.AllocatorForFree = &WriteAllocator;
    datagramBuffer.Data = datagramData;
    datagramBuffer.FreePtr = datagram;
    datagramBuffer.Bytes = sendBytes;

    TONK_DEBUG_ASSERT(Deps.UDPSender != nullptr);
    TONK_DEBUG_ASSERT(HasPeerAddress);

    TONK_VERBOSE_OUTGOING_LOG("sendQueuedDatagram: datagram = ", datagram, " sequenceNumber=",
        sequenceNumber, " sequenceNumberBytes=", sequenceNumberBytes, " bytes=", datagramBuffer.Bytes);

#ifdef TONK_DETAILED_STATS
    DetailStats* stats = Deps.Deets->GetWritePtr();
    for (int i = 0; i < Stats_QueueCount; ++i) {
        stats->Stats[i] += datagram->Stats[i];
    }
    stats->Stats[Stats_PaddingBytesSent] += paddingBytes;
    stats->Stats[Stats_FootersBytesSent] += sendBytes - messageBytes;
#endif // TONK_DETAILED_STATS

    // Write timestamp and final tag - Reduce noise in timestamp measurements
    const uint64_t nowUsec = siamese::GetTimeUsec();
    const uint32_t timestamp24 = (uint32_t)(nowUsec >> kTime23LostBits);
    tag ^= Encryptor.TagInt(protocol::TimestampFlagTagInt(timestamp24, flags));
    siamese::WriteU24_LE(timestampData, timestamp24);
    siamese::WriteU16_LE(tagData, tag);

    const unsigned compressionSavings = datagram->CompressionSavings;

    // Send the data
    Deps.UDPSender->Send(
        PeerUDPAddress,
        datagramBuffer,
        Deps.ConnectionRef);

    // Update bandwidth control
    Deps.SenderControl->OnSendDatagram(
        compressionSavings,
        sendBytes,
        sequenceNumberBytes > 0);
}